

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::RunContext::testForMissingAssertions(RunContext *this,Counts *assertions)

{
  uint uVar1;
  size_t sVar2;
  IConfig *pIVar3;
  ITracker *pIVar4;
  Counts *assertions_local;
  RunContext *this_local;
  
  sVar2 = Counts::total(assertions);
  if (sVar2 == 0) {
    pIVar3 = Ptr<const_Catch::IConfig>::operator->(&this->m_config);
    uVar1 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[9])();
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      pIVar4 = TestCaseTracking::TrackerContext::currentTracker(&this->m_trackerContext);
      uVar1 = (*(pIVar4->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
                _vptr_NonCopyable[8])();
      if ((uVar1 & 1) == 0) {
        (this->m_totals).assertions.failed = (this->m_totals).assertions.failed + 1;
        assertions->failed = assertions->failed + 1;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool testForMissingAssertions( Counts& assertions ) {
            if( assertions.total() != 0 )
                return false;
            if( !m_config->warnAboutMissingAssertions() )
                return false;
            if( m_trackerContext.currentTracker().hasChildren() )
                return false;
            m_totals.assertions.failed++;
            assertions.failed++;
            return true;
        }